

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

bool __thiscall flatbuffers::EnumVal::Deserialize(EnumVal *this,Parser *parser,EnumVal *val)

{
  ushort uVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  unsigned_short vtsize;
  int64_t iVar5;
  Type *type;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  long *local_48 [2];
  long local_38 [2];
  
  uVar3 = (ulong)*(ushort *)(val + (4 - (long)*(int *)val));
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,val + (ulong)*(uint *)(val + uVar3) + 4 + uVar3,
             val + (ulong)*(uint *)(val + (ulong)*(uint *)(val + uVar3) + 4 + uVar3 + -4) +
                   *(uint *)(val + uVar3) + uVar3 + 4);
  std::__cxx11::string::operator=((string *)this,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  uVar1 = *(ushort *)(val + -(long)*(int *)val);
  if (uVar1 < 7) {
    this->value = 0;
  }
  else {
    lVar4 = -(long)*(int *)val;
    if ((ulong)*(ushort *)(val + lVar4 + 6) == 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = *(int64_t *)(val + *(ushort *)(val + lVar4 + 6));
    }
    this->value = iVar5;
    if ((10 < uVar1) && (uVar3 = (ulong)*(ushort *)(val + lVar4 + 10), uVar3 != 0)) {
      type = (Type *)(val + *(uint *)(val + uVar3) + uVar3);
      goto LAB_001210b2;
    }
  }
  type = (Type *)0x0;
LAB_001210b2:
  bVar2 = Type::Deserialize(&this->union_type,parser,type);
  if (bVar2) {
    if ((*(ushort *)(val + -(long)*(int *)val) < 0xf) ||
       (uVar3 = (ulong)*(ushort *)(val + (0xe - (long)*(int *)val)), uVar3 == 0)) {
      attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
    }
    else {
      attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
              (val + *(uint *)(val + uVar3) + uVar3);
    }
    bVar2 = DeserializeAttributesCommon(&this->attributes,parser,attrs);
    if (bVar2) {
      if ((*(ushort *)(val + -(long)*(int *)val) < 0xd) ||
         (uVar3 = (ulong)*(ushort *)(val + (0xc - (long)*(int *)val)), uVar3 == 0)) {
        documentation = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
      }
      else {
        documentation =
             (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
             (val + *(uint *)(val + uVar3) + uVar3);
      }
      anon_unknown_0::DeserializeDoc(&this->doc_comment,documentation);
      return true;
    }
  }
  return false;
}

Assistant:

bool EnumVal::Deserialize(Parser &parser, const reflection::EnumVal *val) {
  name = val->name()->str();
  value = val->value();
  if (!union_type.Deserialize(parser, val->union_type())) return false;
  if (!DeserializeAttributes(parser, val->attributes())) return false;
  DeserializeDoc(doc_comment, val->documentation());
  return true;
}